

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lp_solver.cc
# Opt level: O3

void __thiscall ipx::LpSolver::RunCrossover(LpSolver *this)

{
  Vector *pVVar1;
  Vector *pVVar2;
  Vector *z;
  Model *model;
  double dVar3;
  double dVar4;
  pointer piVar5;
  long lVar6;
  double *pdVar7;
  double *pdVar8;
  ostream *poVar9;
  double *pdVar10;
  long lVar11;
  size_type __new_size;
  fmtflags floatfield;
  Vector *pVVar12;
  long lVar13;
  long lVar14;
  double dVar15;
  Crossover crossover;
  char local_101;
  Vector *local_100;
  vector<int,_std::allocator<int>_> *local_f8;
  Vector *local_f0;
  string local_e8;
  Vector *local_c8;
  Info *local_c0;
  string local_b8;
  string local_98;
  string local_78;
  Crossover local_58;
  
  piVar5 = (this->basic_statuses_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->basic_statuses_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_finish != piVar5) {
    (this->basic_statuses_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_finish = piVar5;
  }
  pdVar10 = (double *)(this->crossover_weights_)._M_size;
  if (pdVar10 != (double *)0x0) {
    pdVar10 = (this->crossover_weights_)._M_data;
  }
  local_100 = (Vector *)(long)(this->model_).num_rows_;
  local_f8 = (vector<int,_std::allocator<int>_> *)(long)(this->model_).num_cols_;
  Crossover::Crossover(&local_58,&this->control_);
  pVVar1 = &this->x_crossover_;
  pVVar2 = &this->y_crossover_;
  z = &this->z_crossover_;
  local_c0 = &this->info_;
  pVVar12 = z;
  Crossover::PushAll(&local_58,
                     (this->basis_)._M_t.
                     super___uniq_ptr_impl<ipx::Basis,_std::default_delete<ipx::Basis>_>._M_t.
                     super__Tuple_impl<0UL,_ipx::Basis_*,_std::default_delete<ipx::Basis>_>.
                     super__Head_base<0UL,_ipx::Basis_*,_false>._M_head_impl,pVVar1,pVVar2,z,pdVar10
                     ,local_c0);
  (this->info_).super_ipx_info.time_crossover = local_58.time_primal_ + local_58.time_dual_;
  (this->info_).super_ipx_info.updates_crossover = local_58.dual_pivots_ + local_58.primal_pivots_;
  if ((this->info_).super_ipx_info.status_crossover == 1) {
    local_f0 = pVVar1;
    local_c8 = z;
    Basis::ComputeBasicSolution
              ((this->basis_)._M_t.
               super___uniq_ptr_impl<ipx::Basis,_std::default_delete<ipx::Basis>_>._M_t.
               super__Tuple_impl<0UL,_ipx::Basis_*,_std::default_delete<ipx::Basis>_>.
               super__Head_base<0UL,_ipx::Basis_*,_false>._M_head_impl,pVVar1,pVVar2,z);
    __new_size = (long)local_f8 + (long)local_100;
    local_f8 = &this->basic_statuses_;
    std::vector<int,_std::allocator<int>_>::resize(&this->basic_statuses_,__new_size);
    piVar5 = (this->basic_statuses_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    lVar11 = (long)(this->basic_statuses_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_finish - (long)piVar5;
    if (lVar11 != 0) {
      lVar11 = lVar11 >> 2;
      lVar6 = *(long *)&(((this->basis_)._M_t.
                          super___uniq_ptr_impl<ipx::Basis,_std::default_delete<ipx::Basis>_>._M_t.
                          super__Tuple_impl<0UL,_ipx::Basis_*,_std::default_delete<ipx::Basis>_>.
                          super__Head_base<0UL,_ipx::Basis_*,_false>._M_head_impl)->map2basis_).
                        super__Vector_base<int,_std::allocator<int>_>._M_impl;
      pdVar10 = (this->model_).lb_._M_data;
      pdVar7 = (this->model_).ub_._M_data;
      pVVar12 = (Vector *)(this->x_crossover_)._M_data;
      pdVar8 = (this->z_crossover_)._M_data;
      lVar13 = 0;
      lVar14 = 0;
      do {
        if (*(int *)(lVar6 + (lVar13 >> 0x1e)) < 0) {
          dVar15 = pdVar10[lVar14];
          dVar3 = pdVar7[lVar14];
          if ((dVar15 != dVar3) || (NAN(dVar15) || NAN(dVar3))) {
            dVar4 = (double)(&pVVar12->_M_size)[lVar14];
            if ((dVar4 != dVar15) || (NAN(dVar4) || NAN(dVar15))) {
              if ((dVar4 != dVar3) || (NAN(dVar4) || NAN(dVar3))) {
                piVar5[lVar14] = -3;
              }
              else {
                piVar5[lVar14] = -2;
              }
            }
            else {
              piVar5[lVar14] = -1;
            }
          }
          else {
            piVar5[lVar14] = 0.0 <= pdVar8[lVar14] | 0xfffffffe;
          }
        }
        else {
          piVar5[lVar14] = 0;
        }
        lVar14 = lVar14 + 1;
        lVar13 = lVar13 + 0x100000000;
      } while (lVar11 + (ulong)(lVar11 == 0) != lVar14);
    }
    floatfield = (fmtflags)pVVar12;
    local_100 = pVVar2;
    poVar9 = Control::Debug(&this->control_,1);
    Textline<char[35]>(&local_b8,(char (*) [35])"Bound violation of basic solution:");
    poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar9,local_b8._M_dataplus._M_p,local_b8._M_string_length);
    pVVar1 = local_f0;
    model = &this->model_;
    dVar15 = PrimalInfeasibility(model,local_f0);
    pVVar2 = local_c8;
    Format_abi_cxx11_(&local_e8,(ipx *)0x0,dVar15,2,0x100,floatfield);
    poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar9,local_e8._M_dataplus._M_p,local_e8._M_string_length);
    local_98._M_dataplus._M_p._0_1_ = 10;
    poVar9 = std::__ostream_insert<char,std::char_traits<char>>(poVar9,(char *)&local_98,1);
    Textline<char[39]>(&local_98,(char (*) [39])"Dual sign violation of basic solution:");
    poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar9,(char *)CONCAT71(local_98._M_dataplus._M_p._1_7_,
                                                local_98._M_dataplus._M_p._0_1_),
                        local_98._M_string_length);
    dVar15 = DualInfeasibility(model,pVVar1,pVVar2);
    Format_abi_cxx11_(&local_78,(ipx *)0x0,dVar15,2,0x100,floatfield);
    poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar9,local_78._M_dataplus._M_p,local_78._M_string_length);
    local_101 = '\n';
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,&local_101,1);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_dataplus._M_p != &local_78.field_2) {
      operator_delete(local_78._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_98._M_dataplus._M_p._1_7_,local_98._M_dataplus._M_p._0_1_) !=
        &local_98.field_2) {
      operator_delete((undefined1 *)
                      CONCAT71(local_98._M_dataplus._M_p._1_7_,local_98._M_dataplus._M_p._0_1_));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
      operator_delete(local_e8._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
      operator_delete(local_b8._M_dataplus._M_p);
    }
    poVar9 = Control::Debug(&this->control_,1);
    Textline<char[40]>(&local_b8,(char (*) [40])"Minimum singular value of basis matrix:");
    poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar9,local_b8._M_dataplus._M_p,local_b8._M_string_length);
    dVar15 = Basis::MinSingularValue
                       ((this->basis_)._M_t.
                        super___uniq_ptr_impl<ipx::Basis,_std::default_delete<ipx::Basis>_>._M_t.
                        super__Tuple_impl<0UL,_ipx::Basis_*,_std::default_delete<ipx::Basis>_>.
                        super__Head_base<0UL,_ipx::Basis_*,_false>._M_head_impl);
    Format_abi_cxx11_(&local_e8,(ipx *)0x0,dVar15,2,0x100,floatfield);
    poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar9,local_e8._M_dataplus._M_p,local_e8._M_string_length);
    local_98._M_dataplus._M_p._0_1_ = 10;
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,(char *)&local_98,1);
    pVVar1 = local_100;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
      operator_delete(local_e8._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
      operator_delete(local_b8._M_dataplus._M_p);
    }
    Model::EvaluateBasicSolution(model,local_f0,pVVar1,pVVar2,local_f8,local_c0);
    dVar15 = (this->info_).super_ipx_info.primal_infeas;
    pdVar10 = &(this->control_).parameters_.super_ipx_parameters.pfeasibility_tol;
    if ((*pdVar10 <= dVar15 && dVar15 != *pdVar10) ||
       (dVar15 = (this->info_).super_ipx_info.dual_infeas,
       pdVar10 = &(this->control_).parameters_.super_ipx_parameters.dfeasibility_tol,
       *pdVar10 <= dVar15 && dVar15 != *pdVar10)) {
      (this->info_).super_ipx_info.status_crossover = 2;
    }
  }
  else {
    if (pVVar1->_M_size != 0) {
      operator_delete((this->x_crossover_)._M_data);
      (this->x_crossover_)._M_size = 0;
      pdVar10 = (double *)operator_new(0);
      (this->x_crossover_)._M_data = pdVar10;
    }
    if (pVVar2->_M_size != 0) {
      operator_delete((this->y_crossover_)._M_data);
      (this->y_crossover_)._M_size = 0;
      pdVar10 = (double *)operator_new(0);
      (this->y_crossover_)._M_data = pdVar10;
    }
    if (z->_M_size != 0) {
      operator_delete((this->z_crossover_)._M_data);
      (this->z_crossover_)._M_size = 0;
      pdVar10 = (double *)operator_new(0);
      (this->z_crossover_)._M_data = pdVar10;
    }
  }
  return;
}

Assistant:

void LpSolver::RunCrossover() {
    assert(basis_);
    const Int m = model_.rows();
    const Int n = model_.cols();
    const Vector& lb = model_.lb();
    const Vector& ub = model_.ub();
    const double *weights = NULL;
    basic_statuses_.clear();

    if (crossover_weights_.size()) {
        assert((Int)crossover_weights_.size() == n+m);
        weights = &crossover_weights_[0];
    }

    Crossover crossover(control_);
    crossover.PushAll(basis_.get(), x_crossover_, y_crossover_, z_crossover_,
                      weights, &info_);
    info_.time_crossover =
        crossover.time_primal() + crossover.time_dual();
    info_.updates_crossover =
        crossover.primal_pivots() + crossover.dual_pivots();
    if (info_.status_crossover != IPX_STATUS_optimal) {
        // Crossover failed. Discard solution.
        x_crossover_.resize(0);
        y_crossover_.resize(0);
        z_crossover_.resize(0);
        return;
    }

    // Recompute vertex solution and set basic statuses.
    basis_->ComputeBasicSolution(x_crossover_, y_crossover_, z_crossover_);
    basic_statuses_.resize(n+m);
    for (size_t j = 0; j < basic_statuses_.size(); j++) {
        if (basis_->IsBasic(j)) {
            basic_statuses_[j] = IPX_basic;
        } else {
            if (lb[j] == ub[j])
                basic_statuses_[j] = z_crossover_[j] >= 0.0 ?
                    IPX_nonbasic_lb : IPX_nonbasic_ub;
            else if (x_crossover_[j] == lb[j])
                basic_statuses_[j] = IPX_nonbasic_lb;
            else if (x_crossover_[j] == ub[j])
                basic_statuses_[j] = IPX_nonbasic_ub;
            else
                basic_statuses_[j] = IPX_superbasic;
        }
    }
    control_.Debug()
        << Textline("Bound violation of basic solution:")
        << sci2(PrimalInfeasibility(model_, x_crossover_)) << '\n'
        << Textline("Dual sign violation of basic solution:")
        << sci2(DualInfeasibility(model_, x_crossover_, z_crossover_)) << '\n';
    control_.Debug()
        << Textline("Minimum singular value of basis matrix:")
        << sci2(basis_->MinSingularValue()) << '\n';

    // Declare crossover status "imprecise" if the vertex solution defined by
    // the final basis does not satisfy tolerances.
    model_.EvaluateBasicSolution(x_crossover_, y_crossover_, z_crossover_,
                                 basic_statuses_, &info_);
    if (info_.primal_infeas > control_.pfeasibility_tol() ||
        info_.dual_infeas > control_.dfeasibility_tol())
        info_.status_crossover = IPX_STATUS_imprecise;
}